

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::BlittingImages::copyRegionToTextureLevel
          (BlittingImages *this,ConstPixelBufferAccess *src,PixelBufferAccess *dst,CopyRegion region
          )

{
  VkOffset3D regionExtent;
  VkOffset3D regionExtent_00;
  VkOffset3D regionExtent_01;
  VkOffset3D regionOffset;
  VkOffset3D regionOffset_00;
  VkOffset3D regionOffset_01;
  bool bVar1;
  MirrorMode mirrorMode_00;
  TextureFormat *pTVar2;
  TextureLevel *pTVar3;
  int width;
  int height;
  int iVar4;
  int width_00;
  int height_00;
  PixelBufferAccess local_450;
  undefined1 local_428 [8];
  PixelBufferAccess unclampedSubRegion_2;
  PixelBufferAccess dstSubRegion_2;
  ConstPixelBufferAccess srcSubRegion_2;
  PixelBufferAccess local_378;
  PixelBufferAccess local_350;
  undefined1 local_328 [8];
  PixelBufferAccess unclampedSubRegion_1;
  ConstPixelBufferAccess stencilSrc;
  undefined1 local_2b0 [8];
  PixelBufferAccess dstSubRegion_1;
  undefined1 local_260 [8];
  ConstPixelBufferAccess srcSubRegion_1;
  PixelBufferAccess local_200;
  PixelBufferAccess local_1d8;
  undefined1 local_1b0 [8];
  PixelBufferAccess unclampedSubRegion;
  ConstPixelBufferAccess depthSrc;
  undefined1 local_138 [8];
  PixelBufferAccess dstSubRegion;
  undefined1 local_e8 [8];
  ConstPixelBufferAccess srcSubRegion;
  FilterMode filter;
  VkOffset3D dstExtent;
  VkOffset3D dstOffset;
  VkOffset3D srcExtent;
  VkOffset3D srcOffset;
  MirrorMode mirrorMode;
  PixelBufferAccess *dst_local;
  ConstPixelBufferAccess *src_local;
  BlittingImages *this_local;
  
  mirrorMode_00 =
       getMirrorMode(region.imageBlit.srcOffsets[0],region.imageBlit.srcOffsets[1],
                     region.imageBlit.dstOffsets[0],region.imageBlit.dstOffsets[1]);
  flipCoordinates(&region,mirrorMode_00);
  regionOffset_01.z = region.imageCopy.srcOffset.z;
  regionOffset_01.x = region._16_4_;
  regionOffset_01.y = region._20_4_;
  regionOffset_00.z = region.imageCopy.srcOffset.z;
  regionOffset_00.x = region._16_4_;
  regionOffset_00.y = region._20_4_;
  regionOffset.z = region.imageCopy.srcOffset.z;
  regionOffset.x = region._16_4_;
  regionOffset.y = region._20_4_;
  srcExtent.y = (deInt32)region.bufferCopy.size;
  width = region.imageCopy.dstSubresource.aspectMask - srcExtent.y;
  srcExtent.z = (deInt32)((ulong)region._16_8_ >> 0x20);
  height = region.imageCopy.dstSubresource.mipLevel - srcExtent.z;
  iVar4 = region.imageCopy.dstSubresource.baseArrayLayer - region._24_4_;
  dstExtent.y = (deInt32)region._56_8_;
  width_00 = region.imageBlit.dstOffsets[1].x - dstExtent.y;
  dstExtent.z = (deInt32)((ulong)region._56_8_ >> 0x20);
  height_00 = region.imageBlit.dstOffsets[1].y - dstExtent.z;
  srcSubRegion.m_data._4_4_ =
       (FilterMode)
       ((this->super_CopiesAndBlittingTestInstance).m_params.field_3.filter == VK_FILTER_LINEAR);
  pTVar2 = tcu::ConstPixelBufferAccess::getFormat(src);
  bVar1 = tcu::isCombinedDepthStencilType(pTVar2->type);
  if (bVar1) {
    pTVar2 = tcu::ConstPixelBufferAccess::getFormat(src);
    bVar1 = tcu::hasDepthComponent(pTVar2->order);
    if (bVar1) {
      tcu::getSubregion((ConstPixelBufferAccess *)&dstSubRegion.super_ConstPixelBufferAccess.m_data,
                        src,srcExtent.y,srcExtent.z,width,height);
      tcu::getEffectiveDepthStencilAccess
                ((ConstPixelBufferAccess *)local_e8,
                 (ConstPixelBufferAccess *)&dstSubRegion.super_ConstPixelBufferAccess.m_data,
                 MODE_DEPTH);
      tcu::getSubregion((PixelBufferAccess *)&depthSrc.m_data,dst,dstExtent.y,dstExtent.z,width_00,
                        height_00);
      tcu::getEffectiveDepthStencilAccess
                ((PixelBufferAccess *)local_138,(PixelBufferAccess *)&depthSrc.m_data,MODE_DEPTH);
      tcu::scale((PixelBufferAccess *)local_138,(ConstPixelBufferAccess *)local_e8,
                 srcSubRegion.m_data._4_4_);
      if (srcSubRegion.m_data._4_4_ == LINEAR) {
        tcu::getEffectiveDepthStencilAccess
                  ((ConstPixelBufferAccess *)&unclampedSubRegion.super_ConstPixelBufferAccess.m_data
                   ,src,MODE_DEPTH);
        pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                 ::operator->(&(this->m_unclampedExpectedTextureLevel).
                               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                             );
        tcu::TextureLevel::getAccess(&local_200,pTVar3);
        tcu::getSubregion(&local_1d8,&local_200,dstExtent.y,dstExtent.z,width_00,height_00);
        tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)local_1b0,&local_1d8,MODE_DEPTH);
        srcSubRegion_1.m_data = (void *)CONCAT44(height,width);
        regionExtent_01.z = iVar4;
        regionExtent_01._0_8_ = srcSubRegion_1.m_data;
        scaleFromWholeSrcBuffer
                  ((PixelBufferAccess *)local_1b0,
                   (ConstPixelBufferAccess *)&unclampedSubRegion.super_ConstPixelBufferAccess.m_data
                   ,regionOffset,regionExtent_01,srcSubRegion.m_data._4_4_);
      }
    }
    pTVar2 = tcu::ConstPixelBufferAccess::getFormat(src);
    bVar1 = tcu::hasStencilComponent(pTVar2->order);
    if (bVar1) {
      tcu::getSubregion((ConstPixelBufferAccess *)
                        &dstSubRegion_1.super_ConstPixelBufferAccess.m_data,src,srcExtent.y,
                        srcExtent.z,width,height);
      tcu::getEffectiveDepthStencilAccess
                ((ConstPixelBufferAccess *)local_260,
                 (ConstPixelBufferAccess *)&dstSubRegion_1.super_ConstPixelBufferAccess.m_data,
                 MODE_STENCIL);
      tcu::getSubregion((PixelBufferAccess *)&stencilSrc.m_data,dst,dstExtent.y,dstExtent.z,width_00
                        ,height_00);
      tcu::getEffectiveDepthStencilAccess
                ((PixelBufferAccess *)local_2b0,(PixelBufferAccess *)&stencilSrc.m_data,MODE_STENCIL
                );
      blit((PixelBufferAccess *)local_2b0,(ConstPixelBufferAccess *)local_260,
           srcSubRegion.m_data._4_4_,mirrorMode_00);
      if (srcSubRegion.m_data._4_4_ == LINEAR) {
        tcu::getEffectiveDepthStencilAccess
                  ((ConstPixelBufferAccess *)
                   &unclampedSubRegion_1.super_ConstPixelBufferAccess.m_data,src,MODE_STENCIL);
        pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                 ::operator->(&(this->m_unclampedExpectedTextureLevel).
                               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                             );
        tcu::TextureLevel::getAccess(&local_378,pTVar3);
        tcu::getSubregion(&local_350,&local_378,dstExtent.y,dstExtent.z,width_00,height_00);
        tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)local_328,&local_350,MODE_STENCIL);
        regionExtent_00.y = height;
        regionExtent_00.x = width;
        regionExtent_00.z = iVar4;
        scaleFromWholeSrcBuffer
                  ((PixelBufferAccess *)local_328,
                   (ConstPixelBufferAccess *)
                   &unclampedSubRegion_1.super_ConstPixelBufferAccess.m_data,regionOffset_00,
                   regionExtent_00,srcSubRegion.m_data._4_4_);
      }
    }
  }
  else {
    tcu::getSubregion((ConstPixelBufferAccess *)&dstSubRegion_2.super_ConstPixelBufferAccess.m_data,
                      src,srcExtent.y,srcExtent.z,width,height);
    tcu::getSubregion((PixelBufferAccess *)&unclampedSubRegion_2.super_ConstPixelBufferAccess.m_data
                      ,dst,dstExtent.y,dstExtent.z,width_00,height_00);
    blit((PixelBufferAccess *)&unclampedSubRegion_2.super_ConstPixelBufferAccess.m_data,
         (ConstPixelBufferAccess *)&dstSubRegion_2.super_ConstPixelBufferAccess.m_data,
         srcSubRegion.m_data._4_4_,mirrorMode_00);
    if (srcSubRegion.m_data._4_4_ == LINEAR) {
      pTVar3 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
               operator->(&(this->m_unclampedExpectedTextureLevel).
                           super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                         );
      tcu::TextureLevel::getAccess(&local_450,pTVar3);
      tcu::getSubregion((PixelBufferAccess *)local_428,&local_450,dstExtent.y,dstExtent.z,width_00,
                        height_00);
      regionExtent.y = height;
      regionExtent.x = width;
      regionExtent.z = iVar4;
      scaleFromWholeSrcBuffer
                ((PixelBufferAccess *)local_428,src,regionOffset_01,regionExtent,
                 srcSubRegion.m_data._4_4_);
    }
  }
  return;
}

Assistant:

void BlittingImages::copyRegionToTextureLevel (tcu::ConstPixelBufferAccess src, tcu::PixelBufferAccess dst, CopyRegion region)
{
	const MirrorMode mirrorMode = getMirrorMode(region.imageBlit.srcOffsets[0],
												region.imageBlit.srcOffsets[1],
												region.imageBlit.dstOffsets[0],
												region.imageBlit.dstOffsets[1]);

	flipCoordinates(region, mirrorMode);

	const VkOffset3D					srcOffset		= region.imageBlit.srcOffsets[0];
	const VkOffset3D					srcExtent		=
	{
		region.imageBlit.srcOffsets[1].x - srcOffset.x,
		region.imageBlit.srcOffsets[1].y - srcOffset.y,
		region.imageBlit.srcOffsets[1].z - srcOffset.z
	};
	const VkOffset3D					dstOffset		= region.imageBlit.dstOffsets[0];
	const VkOffset3D					dstExtent		=
	{
		region.imageBlit.dstOffsets[1].x - dstOffset.x,
		region.imageBlit.dstOffsets[1].y - dstOffset.y,
		region.imageBlit.dstOffsets[1].z - dstOffset.z
	};
	const tcu::Sampler::FilterMode		filter			= (m_params.filter == VK_FILTER_LINEAR) ? tcu::Sampler::LINEAR : tcu::Sampler::NEAREST;

	if (tcu::isCombinedDepthStencilType(src.getFormat().type))
	{
		DE_ASSERT(src.getFormat() == dst.getFormat());
		// Scale depth.
		if (tcu::hasDepthComponent(src.getFormat().order))
		{
			const tcu::ConstPixelBufferAccess	srcSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(src, srcOffset.x, srcOffset.y, srcExtent.x, srcExtent.y), tcu::Sampler::MODE_DEPTH);
			const tcu::PixelBufferAccess		dstSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(dst, dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_DEPTH);
			tcu::scale(dstSubRegion, srcSubRegion, filter);

			if (filter == tcu::Sampler::LINEAR)
			{
				const tcu::ConstPixelBufferAccess	depthSrc			= getEffectiveDepthStencilAccess(src, tcu::Sampler::MODE_DEPTH);
				const tcu::PixelBufferAccess		unclampedSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(m_unclampedExpectedTextureLevel->getAccess(), dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_DEPTH);
				scaleFromWholeSrcBuffer(unclampedSubRegion, depthSrc, srcOffset, srcExtent, filter);
			}
		}

		// Scale stencil.
		if (tcu::hasStencilComponent(src.getFormat().order))
		{
			const tcu::ConstPixelBufferAccess	srcSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(src, srcOffset.x, srcOffset.y, srcExtent.x, srcExtent.y), tcu::Sampler::MODE_STENCIL);
			const tcu::PixelBufferAccess		dstSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(dst, dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_STENCIL);
			blit(dstSubRegion, srcSubRegion, filter, mirrorMode);

			if (filter == tcu::Sampler::LINEAR)
			{
				const tcu::ConstPixelBufferAccess	stencilSrc			= getEffectiveDepthStencilAccess(src, tcu::Sampler::MODE_STENCIL);
				const tcu::PixelBufferAccess		unclampedSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(m_unclampedExpectedTextureLevel->getAccess(), dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_STENCIL);
				scaleFromWholeSrcBuffer(unclampedSubRegion, stencilSrc, srcOffset, srcExtent, filter);
			}
		}
	}
	else
	{
		const tcu::ConstPixelBufferAccess	srcSubRegion	= tcu::getSubregion(src, srcOffset.x, srcOffset.y, srcExtent.x, srcExtent.y);
		const tcu::PixelBufferAccess		dstSubRegion	= tcu::getSubregion(dst, dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y);
		blit(dstSubRegion, srcSubRegion, filter, mirrorMode);

		if (filter == tcu::Sampler::LINEAR)
		{
			const tcu::PixelBufferAccess	unclampedSubRegion	= tcu::getSubregion(m_unclampedExpectedTextureLevel->getAccess(), dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y);
			scaleFromWholeSrcBuffer(unclampedSubRegion, src, srcOffset, srcExtent, filter);
		}
	}
}